

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_btlazy2_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  BYTE *pBVar10;
  U32 UVar11;
  int *piVar12;
  int *piVar13;
  BYTE *pBVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  uint uVar18;
  BYTE *pBVar19;
  U32 UVar20;
  ulong uVar21;
  U32 UVar22;
  int iVar23;
  seqDef *psVar24;
  uint local_b4;
  size_t ofbCandidate;
  uint local_a4;
  int *local_a0;
  ulong local_98;
  int local_90;
  U32 maxDistance;
  BYTE *local_88;
  BYTE *local_80;
  BYTE *local_78;
  int *local_70;
  ulong local_68;
  int *local_60;
  int *local_58;
  int *local_50;
  seqStore_t *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_88 = (ms->window).base;
  local_78 = (ms->window).dictBase;
  uVar5 = (ms->window).dictLimit;
  local_98 = (ulong)uVar5;
  local_80 = local_88 + local_98;
  local_60 = (int *)(local_78 + local_98);
  local_40 = local_78 + (ms->window).lowLimit;
  uVar3 = (ms->cParams).windowLog;
  uVar4 = (ms->cParams).minMatch;
  uVar18 = 6;
  if (uVar4 < 6) {
    uVar18 = uVar4;
  }
  uVar4 = 4;
  if (4 < uVar18) {
    uVar4 = uVar18;
  }
  UVar22 = *rep;
  local_b4 = rep[1];
  ms->lazySkipping = 0;
  maxDistance = 1 << ((byte)uVar3 & 0x1f);
  piVar17 = (int *)((ulong)(local_80 == (BYTE *)src) + (long)src);
  iEnd = (int *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  local_70 = (int *)((long)src + (srcSize - 0x20));
  local_90 = uVar5 - 1;
  piVar13 = (int *)src;
  local_38 = rep;
LAB_0014b656:
  do {
    local_50 = piVar13;
    local_a4 = UVar22;
    if (local_58 <= piVar17) {
      *local_38 = local_a4;
      local_38[1] = local_b4;
      return (long)iEnd - (long)local_50;
    }
    iVar23 = (int)piVar17 - (int)local_88;
    iVar6 = iVar23 + 1;
    UVar22 = (ms->window).lowLimit;
    UVar11 = iVar6 - maxDistance;
    if (iVar6 - UVar22 <= maxDistance) {
      UVar11 = UVar22;
    }
    if (ms->loadedDictEnd != 0) {
      UVar11 = UVar22;
    }
    uVar5 = iVar6 - local_a4;
    pBVar10 = local_78;
    if ((uint)local_98 <= uVar5) {
      pBVar10 = local_88;
    }
    local_a0 = (int *)((long)piVar17 + 1);
    if (local_90 - uVar5 < 3) {
LAB_0014b700:
      uVar16 = 0;
    }
    else {
      uVar16 = 0;
      if (local_a4 <= (iVar23 - UVar11) + 1) {
        if (*local_a0 != *(int *)(pBVar10 + uVar5)) goto LAB_0014b700;
        piVar13 = local_60;
        if ((uint)local_98 <= uVar5) {
          piVar13 = iEnd;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar17 + 5),(BYTE *)((long)(pBVar10 + uVar5) + 4),
                           (BYTE *)iEnd,(BYTE *)piVar13,local_80);
        uVar16 = sVar7 + 4;
      }
    }
    ofbCandidate = 999999999;
    if (uVar4 == 6) {
      uVar8 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)piVar17,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (uVar4 == 5) {
      uVar8 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)piVar17,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar8 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)piVar17,(BYTE *)iEnd,&ofbCandidate);
    }
    uVar9 = uVar16;
    if (uVar16 < uVar8) {
      uVar9 = uVar8;
    }
    if (uVar9 < 4) {
      uVar16 = (long)piVar17 - (long)local_50;
      piVar17 = (int *)((long)piVar17 + (uVar16 >> 8) + 1);
      ms->lazySkipping = (uint)(0x8ff < uVar16);
      UVar22 = local_a4;
      piVar13 = local_50;
      goto LAB_0014b656;
    }
    uVar21 = 1;
    piVar13 = local_a0;
    local_48 = seqStore;
    if (uVar16 < uVar8) {
      uVar21 = ofbCandidate;
      piVar13 = piVar17;
    }
LAB_0014b7b9:
    do {
      local_a0 = piVar13;
      uVar8 = uVar9;
      uVar16 = uVar21;
      if (local_58 <= piVar17) break;
      piVar13 = (int *)((long)piVar17 + 1);
      iVar6 = iVar23 + 1;
      local_68 = CONCAT44(local_68._4_4_,iVar6);
      if (uVar21 == 0) {
        uVar21 = 0;
      }
      else {
        UVar22 = (ms->window).lowLimit;
        UVar11 = iVar6 - maxDistance;
        if (iVar6 - UVar22 <= maxDistance) {
          UVar11 = UVar22;
        }
        if (ms->loadedDictEnd != 0) {
          UVar11 = UVar22;
        }
        uVar5 = iVar6 - local_a4;
        pBVar10 = local_88;
        if (uVar5 < (uint)local_98) {
          pBVar10 = local_78;
        }
        if (((2 < local_90 - uVar5) && (local_a4 <= iVar6 - UVar11)) &&
           (*piVar13 == *(int *)(pBVar10 + uVar5))) {
          piVar12 = iEnd;
          if (uVar5 < (uint)local_98) {
            piVar12 = local_60;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar17 + 5),(BYTE *)((long)(pBVar10 + uVar5) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar12,local_80);
          if (sVar7 < 0xfffffffffffffffc) {
            uVar5 = 0x1f;
            if ((uint)uVar21 != 0) {
              for (; (uint)uVar21 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            if ((int)((uVar5 ^ 0x1f) + (int)uVar8 * 3 + -0x1e) < (int)(sVar7 + 4) * 3) {
              uVar21 = 1;
              uVar8 = sVar7 + 4;
              local_a0 = piVar13;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar4 == 6) {
        uVar9 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)piVar13,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar4 == 5) {
        uVar9 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)piVar13,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar9 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)piVar13,(BYTE *)iEnd,&ofbCandidate);
      }
      seqStore = local_48;
      if (3 < uVar9) {
        uVar5 = 0x1f;
        if ((uint)uVar21 != 0) {
          for (; (uint)uVar21 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        iVar6 = 0x1f;
        if ((uint)ofbCandidate != 0) {
          for (; (uint)ofbCandidate >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        if ((int)((uVar5 ^ 0x1f) + (int)uVar8 * 4 + -0x1b) < (int)uVar9 * 4 - iVar6) {
          piVar17 = piVar13;
          uVar21 = ofbCandidate;
          iVar23 = (int)local_68;
          goto LAB_0014b7b9;
        }
      }
      uVar16 = uVar21;
      if (local_58 <= piVar13) break;
      piVar13 = (int *)((long)piVar17 + 2);
      iVar23 = iVar23 + 2;
      if (uVar21 == 0) {
        uVar16 = 0;
      }
      else {
        UVar22 = (ms->window).lowLimit;
        UVar11 = iVar23 - maxDistance;
        if (iVar23 - UVar22 <= maxDistance) {
          UVar11 = UVar22;
        }
        if (ms->loadedDictEnd != 0) {
          UVar11 = UVar22;
        }
        uVar5 = iVar23 - local_a4;
        pBVar10 = local_88;
        if (uVar5 < (uint)local_98) {
          pBVar10 = local_78;
        }
        if (((2 < local_90 - uVar5) && (local_a4 <= iVar23 - UVar11)) &&
           (*piVar13 == *(int *)(pBVar10 + uVar5))) {
          piVar12 = iEnd;
          if (uVar5 < (uint)local_98) {
            piVar12 = local_60;
          }
          local_68 = uVar21;
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar17 + 6),(BYTE *)((long)(pBVar10 + uVar5) + 4),
                             (BYTE *)iEnd,(BYTE *)piVar12,local_80);
          uVar16 = local_68;
          if (sVar7 < 0xfffffffffffffffc) {
            uVar5 = 0x1f;
            if ((uint)local_68 != 0) {
              for (; (uint)local_68 >> uVar5 == 0; uVar5 = uVar5 - 1) {
              }
            }
            if ((int)((uVar5 ^ 0x1f) + (int)uVar8 * 4 + -0x1e) < (int)(sVar7 + 4) * 4) {
              uVar16 = 1;
              uVar8 = sVar7 + 4;
              local_a0 = piVar13;
            }
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar4 == 6) {
        uVar9 = ZSTD_BtFindBestMatch_extDict_6(ms,(BYTE *)piVar13,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (uVar4 == 5) {
        uVar9 = ZSTD_BtFindBestMatch_extDict_5(ms,(BYTE *)piVar13,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar9 = ZSTD_BtFindBestMatch_extDict_4(ms,(BYTE *)piVar13,(BYTE *)iEnd,&ofbCandidate);
      }
      if (uVar9 < 4) break;
      uVar5 = 0x1f;
      if ((uint)uVar16 != 0) {
        for (; (uint)uVar16 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      iVar6 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      piVar17 = piVar13;
      uVar21 = ofbCandidate;
    } while ((int)((uVar5 ^ 0x1f) + (int)uVar8 * 4 + -0x18) < (int)uVar9 * 4 - iVar6);
    piVar17 = local_a0;
    if (3 < uVar16) {
      pBVar14 = (BYTE *)((long)local_a0 + (-(long)local_88 - uVar16) + 3);
      pBVar19 = local_80;
      pBVar10 = local_88;
      if ((uint)pBVar14 < (uint)local_98) {
        pBVar19 = local_40;
        pBVar10 = local_78;
      }
      pBVar10 = pBVar10 + ((ulong)pBVar14 & 0xffffffff);
      for (; ((local_50 < piVar17 && (pBVar19 < pBVar10)) &&
             (*(BYTE *)((long)piVar17 + -1) == pBVar10[-1])); piVar17 = (int *)((long)piVar17 + -1))
      {
        pBVar10 = pBVar10 + -1;
        uVar8 = uVar8 + 1;
      }
      local_b4 = local_a4;
      local_a4 = (U32)uVar16 - 3;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_0014be88:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_0014bea7:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (long)piVar17 - (long)local_50;
    pBVar10 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar10 + uVar9) {
LAB_0014bee5:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar17) {
LAB_0014bf04:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_70 < piVar17) {
      ZSTD_safecopyLiterals(pBVar10,(BYTE *)local_50,(BYTE *)piVar17,(BYTE *)local_70);
LAB_0014bba5:
      seqStore->lit = seqStore->lit + uVar9;
      if (0xffff < uVar9) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar2 = *(undefined8 *)(local_50 + 2);
      *(undefined8 *)pBVar10 = *(undefined8 *)local_50;
      *(undefined8 *)(pBVar10 + 8) = uVar2;
      pBVar10 = seqStore->lit;
      if (0x10 < uVar9) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar10 + 0x10 + (-0x10 - (long)(local_50 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar2 = *(undefined8 *)(local_50 + 6);
        *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)(local_50 + 4);
        *(undefined8 *)(pBVar10 + 0x18) = uVar2;
        if (0x20 < (long)uVar9) {
          lVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_50 + lVar15 + 0x20);
            uVar2 = puVar1[1];
            pBVar19 = pBVar10 + lVar15 + 0x20;
            *(undefined8 *)pBVar19 = *puVar1;
            *(undefined8 *)(pBVar19 + 8) = uVar2;
            puVar1 = (undefined8 *)((long)local_50 + lVar15 + 0x30);
            uVar2 = puVar1[1];
            *(undefined8 *)(pBVar19 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar19 + 0x18) = uVar2;
            lVar15 = lVar15 + 0x20;
          } while (pBVar19 + 0x20 < pBVar10 + uVar9);
        }
        goto LAB_0014bba5;
      }
      seqStore->lit = pBVar10 + uVar9;
    }
    psVar24 = seqStore->sequences;
    psVar24->litLength = (U16)uVar9;
    psVar24->offBase = (U32)uVar16;
    if (uVar8 < 3) {
LAB_0014bec6:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar8 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_0014bf23:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar24->mlBase = (U16)(uVar8 - 3);
    psVar24 = psVar24 + 1;
    seqStore->sequences = psVar24;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar5 = local_a4;
    for (piVar17 = (int *)((long)piVar17 + uVar8); UVar22 = uVar5, piVar13 = piVar17,
        piVar17 <= local_58; piVar17 = (int *)((long)piVar17 + sVar7 + 4)) {
      iVar6 = (int)piVar17 - (int)local_88;
      UVar11 = (ms->window).lowLimit;
      UVar20 = iVar6 - maxDistance;
      if (iVar6 - UVar11 <= maxDistance) {
        UVar20 = UVar11;
      }
      if (ms->loadedDictEnd != 0) {
        UVar20 = UVar11;
      }
      uVar5 = iVar6 - local_b4;
      pBVar10 = local_88;
      if (uVar5 < (uint)local_98) {
        pBVar10 = local_78;
      }
      if (((local_90 - uVar5 < 3) || (iVar6 - UVar20 < local_b4)) ||
         (*piVar17 != *(int *)(pBVar10 + uVar5))) break;
      local_a0 = (int *)CONCAT44(local_a0._4_4_,local_b4);
      piVar13 = iEnd;
      if (uVar5 < (uint)local_98) {
        piVar13 = local_60;
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)(piVar17 + 1),(BYTE *)((long)(pBVar10 + uVar5) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar13,local_80);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar24 - (long)seqStore->sequencesStart >> 3))
      goto LAB_0014be88;
      if (0x20000 < seqStore->maxNbLit) goto LAB_0014bea7;
      pBVar10 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar10) goto LAB_0014bee5;
      if (iEnd < piVar17) goto LAB_0014bf04;
      if (local_70 < piVar17) {
        ZSTD_safecopyLiterals(pBVar10,(BYTE *)piVar17,(BYTE *)piVar17,(BYTE *)local_70);
      }
      else {
        uVar2 = *(undefined8 *)(piVar17 + 2);
        *(undefined8 *)pBVar10 = *(undefined8 *)piVar17;
        *(undefined8 *)(pBVar10 + 8) = uVar2;
      }
      psVar24 = seqStore->sequences;
      psVar24->litLength = 0;
      psVar24->offBase = 1;
      if (sVar7 + 4 < 3) goto LAB_0014bec6;
      if (0xffff < sVar7 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_0014bf23;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar24 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar24->mlBase = (U16)(sVar7 + 1);
      psVar24 = psVar24 + 1;
      seqStore->sequences = psVar24;
      uVar5 = (uint)local_a0;
      local_b4 = UVar22;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2);
}